

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O0

double exparg(int l)

{
  int iVar1;
  int m;
  double lnb;
  int l_local;
  
  iVar1 = -0x3fe;
  if (l == 0) {
    iVar1 = 0x400;
  }
  return (double)iVar1 * 0.69314718055995 * 0.99999;
}

Assistant:

static double exparg(int l)
{
/* -------------------------------------------------------------------- */
/*     IF L = 0 THEN  EXPARG(L) = THE LARGEST POSITIVE W FOR WHICH
 *     EXP(W) CAN BE COMPUTED.  ==>  exparg(0) = 709.7827  nowadays. */

/*     IF L IS NONZERO THEN  EXPARG(L) = THE LARGEST NEGATIVE W FOR
 *     WHICH THE COMPUTED VALUE OF EXP(W) IS NONZERO.
 *       ==> exparg(1) = -708.3964   nowadays. */

/*     Note... only an approximate value for exparg(L) is needed. */
/* -------------------------------------------------------------------- */

    double lnb = .69314718055995;
    int m = (l == 0) ? DBL_MAX_EXP : DBL_MIN_EXP - 1;

    return m * lnb * .99999;
}